

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_b3lyp.c
# Opt level: O0

void xc_hyb_gga_xc_apf_init(xc_func_type *p)

{
  xc_func_type *in_RDI;
  double funcs_coef [6];
  int funcs_id [6];
  double xpbe0;
  double xb3pw91;
  double fpbe0;
  double fb3pw91;
  
  xc_mix_init((xc_func_type *)0x3fd54e65bea0ba1f,0x3fb3fdb4,(int *)0x3fd2f05a708ede54,
              (double *)0x3fa0d5a5b9628cc1);
  xc_hyb_init_hybrid(in_RDI,0.22945);
  return;
}

Assistant:

void
xc_hyb_gga_xc_apf_init(xc_func_type *p)
{
  /* Functional is 41.1% B3PW91 and 58.9% PBE0 */
  const double fb3pw91 = 0.411;
  const double fpbe0   = 1.0 - fb3pw91;

  /* Exact exchange in B3PW91 and PBE0 */
  const double xb3pw91 = 0.20;
  const double xpbe0   = 0.25;

  int funcs_id [6] = {XC_LDA_X, XC_GGA_X_B88, XC_LDA_C_PW, XC_GGA_C_PW91, XC_GGA_X_PBE, XC_GGA_C_PBE};

  /* Used C standard doesn't allow initializer list, even with const
     variables */
  double funcs_coef[6];
  funcs_coef[0]=(1.0 - xb3pw91 - 0.72)*fb3pw91;
  funcs_coef[1]=0.72*fb3pw91;
  funcs_coef[2]=(1.0 - 0.81)*fb3pw91;
  funcs_coef[3]=0.81*fb3pw91;
  funcs_coef[4]=(1.0 - xpbe0)*fpbe0;
  funcs_coef[5]=fpbe0;

  xc_mix_init(p, 6, funcs_id, funcs_coef);
  xc_hyb_init_hybrid(p, fb3pw91*xb3pw91 + fpbe0*xpbe0);
}